

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnodewalk.h
# Opt level: O3

ResultType __thiscall
ParseNodeWalker<WalkerPolicyTest>::WalkList
          (ParseNodeWalker<WalkerPolicyTest> *this,ParseNode *pnodeparent,ParseNode **pnode,
          Context context)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  ParseNode *pPVar4;
  ParseNodeBin *pPVar5;
  undefined1 uVar6;
  
  uVar6 = 1;
  lVar1._0_1_ = pnodeparent->nop;
  lVar1._1_1_ = pnodeparent->field_0x1;
  lVar1._2_2_ = pnodeparent->grfpn;
  lVar1._4_4_ = pnodeparent->ichMin;
  if ((lVar1 != 0) &&
     (bVar2 = ThreadContext::IsCurrentStackAvailable(0x2400), pPVar4 = pnodeparent, bVar2)) {
    while( true ) {
      pPVar4 = *(ParseNode **)pPVar4;
      if (((pPVar4->nop != knopList) || ((pPVar4->grfpn & 0x100) != 0)) &&
         ((pPVar4->nop != **(OpCode **)pnodeparent ||
          (((pPVar4->grfpn & *(undefined2 *)(*(OpCode **)pnodeparent + 2)) >> 8 & 1) == 0)))) {
        iVar3 = (**(this->super_WalkerPolicyTest).
                   super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
                   _vptr_WalkerPolicyBase)(this,pPVar4,pnode);
        return SUB41(iVar3,0);
      }
      ParseNode::AsParseNodeBin(pPVar4);
      pPVar5 = ParseNode::AsParseNodeBin(pPVar4);
      iVar3 = (**(this->super_WalkerPolicyTest).
                 super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
                 _vptr_WalkerPolicyBase)(this,pPVar5->pnode1,pnode);
      uVar6 = (undefined1)iVar3;
      bVar2 = ThreadContext::IsCurrentStackAvailable(0x2400);
      if (!bVar2) break;
      pPVar5 = ParseNode::AsParseNodeBin(pPVar4);
      pPVar4 = (ParseNode *)&pPVar5->pnode2;
    }
  }
  return (ResultType)uVar6;
}

Assistant:

ResultType WalkList(ParseNode *pnodeparent, ParseNode *&pnode, Context context)
    {
        ResultType result = DefaultResult();
        bool first = true;
        if (pnode)
        {
            result = WalkListNode(pnode, context);
            if (!ContinueWalk(result)) return result;

            ParseNodePtr current = pnode;
            ParseNodePtr *ppnode = &pnode;
            // Skip list nodes and nested VarDeclList nodes
            while ((current->nop == knopList && (current->grfpn & PNodeFlags::fpnDclList) == 0) ||
                   (current->nop == pnode->nop && (current->grfpn & pnode->grfpn & PNodeFlags::fpnDclList)))
            {
                WalkReference(&current->AsParseNodeBin()->pnode1, context);
                result = first ? WalkFirstChild(current->AsParseNodeBin()->pnode1, context) : WalkNthChild(pnodeparent, current->AsParseNodeBin()->pnode1, context);
                first = false;
                if (!ContinueWalk(result)) return result;
                ppnode = &current->AsParseNodeBin()->pnode2;
                current = *ppnode;
            }
            WalkReference(ppnode, context);
            result = first ? WalkFirstChild(*ppnode, context) : WalkNthChild(pnodeparent, *ppnode, context);
        }
        // Reset the reference back.
        WalkReference(nullptr, context);
        return result;
    }